

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall
Sale::Sale(Sale *this,int id,int quantity,string *date,string *customerName,Medicine *medicine)

{
  pointer pcVar1;
  
  this->id = id;
  this->quantity = quantity;
  (this->date)._M_dataplus._M_p = (pointer)&(this->date).field_2;
  pcVar1 = (date->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->date,pcVar1,pcVar1 + date->_M_string_length);
  (this->customerName)._M_dataplus._M_p = (pointer)&(this->customerName).field_2;
  pcVar1 = (customerName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->customerName,pcVar1,pcVar1 + customerName->_M_string_length);
  Medicine::Medicine(&this->medicine,medicine);
  return;
}

Assistant:

Sale(int id, int quantity, const string &date, const string &customerName, const Medicine &medicine) : id(id),
                                                                                                           quantity(
                                                                                                                   quantity),
                                                                                                           date(date),
                                                                                                           customerName(
                                                                                                                   customerName),
                                                                                                           medicine(
                                                                                                                   medicine) {}